

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

Circle * EDCircles::addCircle
                   (Circle *circles,int *noCircles,double xc,double yc,double r,
                   double circleFitError,EllipseEquation *pEq,double ellipseFitError,double *x,
                   double *y,int noPixels)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  iVar2 = *noCircles;
  circles[iVar2].xc = xc;
  circles[iVar2].yc = yc;
  circles[iVar2].r = r;
  circles[iVar2].circleFitError = circleFitError;
  dVar3 = computeEllipsePerimeter(pEq);
  iVar2 = *noCircles;
  circles[iVar2].coverRatio = (double)noPixels / dVar3;
  circles[iVar2].x = x;
  circles[iVar2].y = y;
  circles[iVar2].noPixels = noPixels;
  iVar2 = *noCircles;
  circles[iVar2].eq.coeff[6] = pEq->coeff[6];
  dVar3 = pEq->coeff[0];
  dVar4 = pEq->coeff[1];
  dVar5 = pEq->coeff[2];
  dVar6 = pEq->coeff[3];
  dVar7 = pEq->coeff[5];
  pdVar1 = circles[iVar2].eq.coeff + 4;
  *pdVar1 = pEq->coeff[4];
  pdVar1[1] = dVar7;
  pdVar1 = circles[iVar2].eq.coeff + 2;
  *pdVar1 = dVar5;
  pdVar1[1] = dVar6;
  circles[iVar2].eq.coeff[0] = dVar3;
  circles[iVar2].eq.coeff[1] = dVar4;
  iVar2 = *noCircles;
  circles[iVar2].ellipseFitError = ellipseFitError;
  circles[iVar2].isEllipse = true;
  *noCircles = iVar2 + 1;
  return circles + iVar2;
}

Assistant:

Circle * EDCircles::addCircle(Circle *circles, int &noCircles,double xc, double yc, double r, double circleFitError, EllipseEquation * pEq, double ellipseFitError, double * x, double * y, int noPixels)
{
	circles[noCircles].xc = xc;
	circles[noCircles].yc = yc;
	circles[noCircles].r = r;
	circles[noCircles].circleFitError = circleFitError;
	circles[noCircles].coverRatio = noPixels / computeEllipsePerimeter(pEq);

	circles[noCircles].x = x;
	circles[noCircles].y = y;
	circles[noCircles].noPixels = noPixels;

	circles[noCircles].eq = *pEq;
	circles[noCircles].ellipseFitError = ellipseFitError;
	circles[noCircles].isEllipse = true;

	noCircles++;

	return &circles[noCircles - 1];
}